

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

SyntaxNode * slang::ast::findOverrideNodeSource(HierarchyOverrideNode *node)

{
  char_pointer puVar1;
  char_pointer puVar2;
  pointer ppVar3;
  uint uVar4;
  char_pointer puVar5;
  SyntaxNode *pSVar6;
  char_pointer puVar7;
  uint uVar8;
  pointer ppVar9;
  table_element_pointer ppVar10;
  BindDirectiveSyntax *unaff_RBX;
  BindDirectiveSyntax *pBVar11;
  char_pointer puVar12;
  flat_hash_map<const_syntax::SyntaxNode_*,_std::pair<ConstantValue,_const_syntax::SyntaxNode_*>_>
  *__range3;
  char_pointer puVar13;
  table_element_pointer ppVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  iterator iVar18;
  iterator iVar19;
  
  if ((node->paramOverrides).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
      .size_ctrl.size != 0) {
    iVar18 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
             ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                      *)node);
    bVar15 = iVar18.p_ == (table_element_pointer)0x0;
    if ((!bVar15) &&
       (pBVar11 = (BindDirectiveSyntax *)((iVar18.p_)->second).second, unaff_RBX = pBVar11,
       pBVar11 == (BindDirectiveSyntax *)0x0)) {
LAB_002ce425:
      puVar12 = iVar18.pc_ + 2;
      do {
        puVar5 = puVar12;
        puVar12 = iVar18.pc_;
        ppVar10 = iVar18.p_ + 1;
        if (((uint)iVar18.pc_ & 0xf) == 0xe) goto LAB_002ce46d;
        puVar1 = puVar5 + -1;
        iVar18.p_ = ppVar10;
        iVar18.pc_ = puVar12 + 1;
        puVar12 = puVar5 + 1;
      } while (*puVar1 == '\0');
      puVar5 = puVar5 + -1;
      if (*puVar1 == '\x01') {
        ppVar10 = (table_element_pointer)0x0;
      }
      goto LAB_002ce451;
    }
LAB_002ce4ba:
    if (!bVar15) {
      return (SyntaxNode *)unaff_RBX;
    }
  }
  ppVar9 = (node->binds).
           super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (node->binds).
           super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar15 = ppVar9 == ppVar3;
  pBVar11 = unaff_RBX;
  if (!bVar15) {
    pBVar11 = (ppVar9->first).bindSyntax;
    while (pBVar11 == (BindDirectiveSyntax *)0x0) {
      ppVar9 = ppVar9 + 1;
      bVar15 = ppVar9 == ppVar3;
      pBVar11 = unaff_RBX;
      if (bVar15) break;
      pBVar11 = (ppVar9->first).bindSyntax;
    }
  }
  if (bVar15) {
    iVar19 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
             ::begin(&(node->childNodes).table_);
    if (iVar19.p_ != (table_element_pointer)0x0) {
LAB_002ce523:
      pSVar6 = findOverrideNodeSource(&(iVar19.p_)->second);
      if (pSVar6 != (SyntaxNode *)0x0) {
        return pSVar6;
      }
      puVar7 = iVar19.pc_ + 2;
      do {
        puVar13 = puVar7;
        puVar7 = iVar19.pc_;
        ppVar14 = iVar19.p_ + 1;
        if (((uint)iVar19.pc_ & 0xf) == 0xe) goto LAB_002ce572;
        puVar2 = puVar13 + -1;
        iVar19.p_ = ppVar14;
        iVar19.pc_ = puVar7 + 1;
        puVar7 = puVar13 + 1;
      } while (*puVar2 == '\0');
      puVar13 = puVar13 + -1;
      if (*puVar2 == '\x01') {
        ppVar14 = (table_element_pointer)0x0;
      }
      goto LAB_002ce566;
    }
LAB_002ce5c2:
    pBVar11 = (BindDirectiveSyntax *)0x0;
  }
  return (SyntaxNode *)pBVar11;
LAB_002ce46d:
  do {
    auVar17[0] = -(*puVar5 == '\0');
    auVar17[1] = -(puVar5[1] == '\0');
    auVar17[2] = -(puVar5[2] == '\0');
    auVar17[3] = -(puVar5[3] == '\0');
    auVar17[4] = -(puVar5[4] == '\0');
    auVar17[5] = -(puVar5[5] == '\0');
    auVar17[6] = -(puVar5[6] == '\0');
    auVar17[7] = -(puVar5[7] == '\0');
    auVar17[8] = -(puVar5[8] == '\0');
    auVar17[9] = -(puVar5[9] == '\0');
    auVar17[10] = -(puVar5[10] == '\0');
    auVar17[0xb] = -(puVar5[0xb] == '\0');
    auVar17[0xc] = -(puVar5[0xc] == '\0');
    auVar17[0xd] = -(puVar5[0xd] == '\0');
    auVar17[0xe] = -(puVar5[0xe] == '\0');
    auVar17[0xf] = -(puVar5[0xf] == '\0');
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    if (uVar8 == 0x7fff) {
      puVar5 = puVar5 + 0x10;
      ppVar10 = ppVar10 + 0xf;
    }
    else {
      uVar4 = 0;
      if ((uVar8 ^ 0x7fff) != 0) {
        for (; ((uVar8 ^ 0x7fff) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      if (puVar5[uVar4] == '\x01') {
        ppVar10 = (table_element_pointer)0x0;
      }
      else {
        puVar5 = puVar5 + uVar4;
        ppVar10 = ppVar10 + uVar4;
      }
    }
  } while (uVar8 == 0x7fff);
LAB_002ce451:
  iVar18.p_ = ppVar10;
  iVar18.pc_ = puVar5;
  bVar15 = ppVar10 == (table_element_pointer)0x0;
  unaff_RBX = pBVar11;
  if ((bVar15) ||
     (unaff_RBX = (BindDirectiveSyntax *)(ppVar10->second).second,
     unaff_RBX != (BindDirectiveSyntax *)0x0)) goto LAB_002ce4ba;
  goto LAB_002ce425;
LAB_002ce572:
  do {
    auVar16[0] = -(*puVar13 == '\0');
    auVar16[1] = -(puVar13[1] == '\0');
    auVar16[2] = -(puVar13[2] == '\0');
    auVar16[3] = -(puVar13[3] == '\0');
    auVar16[4] = -(puVar13[4] == '\0');
    auVar16[5] = -(puVar13[5] == '\0');
    auVar16[6] = -(puVar13[6] == '\0');
    auVar16[7] = -(puVar13[7] == '\0');
    auVar16[8] = -(puVar13[8] == '\0');
    auVar16[9] = -(puVar13[9] == '\0');
    auVar16[10] = -(puVar13[10] == '\0');
    auVar16[0xb] = -(puVar13[0xb] == '\0');
    auVar16[0xc] = -(puVar13[0xc] == '\0');
    auVar16[0xd] = -(puVar13[0xd] == '\0');
    auVar16[0xe] = -(puVar13[0xe] == '\0');
    auVar16[0xf] = -(puVar13[0xf] == '\0');
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
    if (uVar8 == 0x7fff) {
      puVar13 = puVar13 + 0x10;
      ppVar14 = ppVar14 + 0xf;
    }
    else {
      uVar4 = 0;
      if ((uVar8 ^ 0x7fff) != 0) {
        for (; ((uVar8 ^ 0x7fff) >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      if (puVar13[uVar4] == '\x01') {
        ppVar14 = (table_element_pointer)0x0;
      }
      else {
        puVar13 = puVar13 + uVar4;
        ppVar14 = (table_element_pointer)((long)&(ppVar14->first).value + (ulong)(uVar4 << 7));
      }
    }
  } while (uVar8 == 0x7fff);
LAB_002ce566:
  iVar19.p_ = ppVar14;
  iVar19.pc_ = puVar13;
  if (ppVar14 == (table_element_pointer)0x0) goto LAB_002ce5c2;
  goto LAB_002ce523;
}

Assistant:

static const SyntaxNode* findOverrideNodeSource(const HierarchyOverrideNode& node) {
    // Try to find some concrete syntax node (defparam or bind directive) that
    // caused us to have this override node.
    if (!node.paramOverrides.empty()) {
        for (auto& [_, val] : node.paramOverrides) {
            if (val.second)
                return val.second;
        }
    }

    for (auto& [info, _] : node.binds) {
        if (info.bindSyntax)
            return info.bindSyntax;
    }

    for (auto& [_, val] : node.childNodes) {
        if (auto result = findOverrideNodeSource(val))
            return result;
    }

    return nullptr;
}